

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

bool __thiscall Kernel::Clause::isHorn(Clause *this)

{
  bool bVar1;
  Elem ppLVar2;
  Literal *l;
  StlIter __end1;
  StlIter __begin1;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  *__range1;
  bool posFound;
  StlIter *in_stack_ffffffffffffff98;
  StlIter *in_stack_ffffffffffffffa0;
  Clause *in_stack_ffffffffffffffb0;
  undefined1 local_38 [24];
  undefined1 *local_20;
  byte local_11;
  
  local_11 = 0;
  iterLits(in_stack_ffffffffffffffb0);
  local_20 = local_38;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
           *)in_stack_ffffffffffffff98);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
         *)in_stack_ffffffffffffff98);
  do {
    bVar1 = Lib::operator!=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (!bVar1) {
      return true;
    }
    ppLVar2 = Lib::
              IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
              ::StlIter::operator*((StlIter *)0x842544);
    in_stack_ffffffffffffffa0 = (StlIter *)*ppLVar2;
    bVar1 = Literal::isPositive((Literal *)0x842556);
    if (bVar1) {
      if ((local_11 & 1) != 0) {
        return false;
      }
      local_11 = 1;
    }
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::StlIter::operator++(in_stack_ffffffffffffffa0);
  } while( true );
}

Assistant:

bool Clause::isHorn()
{
  bool posFound=false;
  for (Literal* l : iterLits()) {
    if (l->isPositive()) {
      if (posFound) {
        return false;
      }
      else {
        posFound=true;
      }
    }
  }
  return true;
}